

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::checkEitherError
               (TestContext *testCtx,Context *ctx,GLenum expectA,GLenum expectB)

{
  TestLog *this;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  char (*local_218) [5];
  bool local_1f9;
  Enum<int,_2UL> local_1e8;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  bool local_25;
  GLenum local_24;
  GLenum GStack_20;
  bool isOk;
  GLenum result;
  GLenum expectB_local;
  GLenum expectA_local;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  GStack_20 = expectB;
  result = expectA;
  _expectB_local = ctx;
  ctx_local = (Context *)testCtx;
  local_24 = (*ctx->_vptr_Context[0x79])();
  local_1f9 = local_24 == result || local_24 == GStack_20;
  local_25 = local_1f9;
  this = tcu::TestContext::getLog((TestContext *)ctx_local);
  tcu::TestLog::operator<<(&local_1a8,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [4])"// ");
  if ((local_25 & 1U) == 0) {
    local_218 = (char (*) [5])0xab6e2f;
  }
  else {
    local_218 = (char (*) [5])0xae33d5;
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_218);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])0xae33e1);
  EVar2 = glu::getErrorStr(result);
  local_1d8 = EVar2.m_getName;
  local_1d0 = EVar2.m_value;
  local_1c8[0].m_getName = local_1d8;
  local_1c8[0].m_value = local_1d0;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [5])" or ");
  EVar2 = glu::getErrorStr(GStack_20);
  local_1e8.m_getName = EVar2.m_getName;
  local_1e8.m_value = EVar2.m_value;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1e8);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  if ((local_25 & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((TestContext *)ctx_local,QP_TEST_RESULT_FAIL,"Error code mismatch");
  }
  return;
}

Assistant:

static void checkEitherError (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum expectA, GLenum expectB)
{
	GLenum	result	= ctx.getError();
	bool	isOk	= (result == expectA || result == expectB);

	testCtx.getLog() << TestLog::Message << "// " << (isOk ? "Pass" : "Fail") << ", expected " << glu::getErrorStr(expectA) << " or " << glu::getErrorStr(expectB) << TestLog::EndMessage;

	if (!isOk)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error code mismatch");
}